

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_array_defs.h
# Opt level: O1

void __thiscall
ON_SimpleArray<ON_SurfaceCurvature>::Append
          (ON_SimpleArray<ON_SurfaceCurvature> *this,ON_SurfaceCurvature *x)

{
  int iVar1;
  ON_SurfaceCurvature *pOVar2;
  double dVar3;
  ON_SurfaceCurvature *memblock;
  int iVar4;
  uint uVar5;
  
  iVar1 = this->m_count;
  memblock = x;
  if (iVar1 == this->m_capacity) {
    if (iVar1 < 8 || (ulong)((long)iVar1 << 4) < 0x10000001) {
      uVar5 = 4;
      if (2 < iVar1) {
        uVar5 = iVar1 * 2;
      }
    }
    else {
      iVar4 = 0x1000008;
      if (iVar1 < 0x1000008) {
        iVar4 = iVar1;
      }
      uVar5 = iVar4 + iVar1;
    }
    if (x < this->m_a + this->m_capacity && this->m_a <= x) {
      memblock = (ON_SurfaceCurvature *)onmalloc(0x10);
      dVar3 = x->k2;
      memblock->k1 = x->k1;
      memblock->k2 = dVar3;
    }
    if ((uint)this->m_capacity < uVar5) {
      SetCapacity(this,(long)(int)uVar5);
    }
    if (this->m_a == (ON_SurfaceCurvature *)0x0) {
      ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_array_defs.h"
                 ,0x1f0,"","allocation failure");
      return;
    }
  }
  pOVar2 = this->m_a;
  iVar1 = this->m_count;
  this->m_count = iVar1 + 1;
  dVar3 = memblock->k2;
  pOVar2[iVar1].k1 = memblock->k1;
  pOVar2[iVar1].k2 = dVar3;
  if (memblock == x) {
    return;
  }
  onfree(memblock);
  return;
}

Assistant:

void ON_SimpleArray<T>::Append( const T& x ) 
{
  const T* p = &x;
  if ( m_count == m_capacity ) 
  {
    const int newcapacity = NewCapacity();
    if ( p >= m_a && p < (m_a + m_capacity) )
    {
      // 26 Sep 2005 Dale Lear
      // x is in the block of memory about to be reallocated.
      void* temp = onmalloc(sizeof(T));
      memcpy(temp, (void*)p, sizeof(T));
      p = (T*)temp;
    }
    Reserve(newcapacity);
    if (nullptr == m_a)
    {
      ON_ERROR("allocation failure");
      return;
    }
  }
  m_a[m_count++] = *p;
  if (p != &x)
    onfree((void*)p);
}